

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equipartitionTest.cpp
# Opt level: O3

void __thiscall OpenMD::Equipartition::doFrame(Equipartition *this,int param_1)

{
  SelectionManager *this_00;
  double *pdVar1;
  undefined4 *puVar2;
  double dVar3;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  undefined1 auVar6 [16];
  double dVar7;
  uint i_2;
  StuntDouble *pSVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int i;
  Vector3d angMom_Temp;
  Vector3d linMom_Temp;
  Mat3x3d momentInertia;
  int local_124;
  double local_120;
  undefined1 local_118 [32];
  value_type local_f8;
  double local_d8;
  double local_d0;
  undefined1 local_c8 [16];
  SelectionSet local_b8;
  double local_98;
  double local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  double local_58;
  double dStack_50;
  double local_48 [4];
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_b8,&(this->super_SequentialAnalyzer).evaluator1_);
    lVar11 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar11),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_b8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar11));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_b8.bitsets_);
  }
  local_f8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_f8.super_Vector<double,_3U>.data_[1] = 0.0;
  iVar10 = 0;
  local_f8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_118._0_8_ = 0.0;
  local_118._8_16_ = ZEXT816(0);
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  pSVar8 = SelectionManager::beginSelected(this_00,&local_124);
  dVar3 = 0.0;
  if (pSVar8 != (StuntDouble *)0x0) {
    local_120 = 0.0;
    local_d0 = 0.0;
    local_c8 = ZEXT816(0);
    local_58 = 0.0;
    dStack_50 = 0.0;
    do {
      DVar4 = pSVar8->storage_;
      pSVar5 = pSVar8->snapshotMan_->currentSnapshot_;
      lVar9 = (long)pSVar8->localIndex_;
      lVar11 = *(long *)((long)&(pSVar5->atomData).velocity.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + DVar4);
      local_48[2] = (double)*(undefined8 *)(lVar11 + 0x10 + lVar9 * 0x18);
      pdVar1 = (double *)(lVar11 + lVar9 * 0x18);
      local_48[0] = *pdVar1;
      local_48[1] = pdVar1[1];
      dVar3 = pSVar8->mass_;
      local_b8.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar11 = 0;
      do {
        (&local_b8.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start)[lVar11] = (pointer)(local_48[lVar11] * dVar3);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      dVar3 = dVar3 * 8.31451e-07;
      auVar15._0_8_ =
           (double)local_b8.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start *
           (double)local_b8.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      auVar15._8_8_ =
           (double)local_b8.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_finish *
           (double)local_b8.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      auVar16._8_8_ = dVar3;
      auVar16._0_8_ = dVar3;
      auVar16 = divpd(auVar15,auVar16);
      local_f8.super_Vector<double,_3U>.data_[0] = local_58 + auVar16._0_8_;
      local_f8.super_Vector<double,_3U>.data_[1] = dStack_50 + auVar16._8_8_;
      local_f8.super_Vector<double,_3U>.data_[2] =
           local_d0 +
           ((double)local_b8.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage *
           (double)local_b8.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) / dVar3;
      local_d0 = local_f8.super_Vector<double,_3U>.data_[2];
      local_58 = local_f8.super_Vector<double,_3U>.data_[0];
      dStack_50 = local_f8.super_Vector<double,_3U>.data_[1];
      if (pSVar8->objType_ - otDAtom < 2) {
        lVar11 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + DVar4);
        local_d8 = *(double *)(lVar11 + lVar9 * 0x18);
        local_d8 = local_d8 * local_d8;
        puVar2 = (undefined4 *)(lVar11 + 8 + lVar9 * 0x18);
        local_68 = *puVar2;
        uStack_64 = puVar2[1];
        uStack_60 = puVar2[2];
        uStack_5c = puVar2[3];
        (*pSVar8->_vptr_StuntDouble[5])(&local_b8,pSVar8);
        local_120 = local_120 +
                    local_d8 /
                    ((double)local_b8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start * 8.31451e-07);
        auVar14._0_8_ = (double)CONCAT44(uStack_64,local_68) * (double)CONCAT44(uStack_64,local_68);
        auVar14._8_8_ =
             (double)CONCAT44(uStack_5c,uStack_60) * (double)CONCAT44(uStack_5c,uStack_60);
        auVar6._8_4_ = SUB84(local_78 * 8.31451e-07,0);
        auVar6._0_8_ = local_98 * 8.31451e-07;
        auVar6._12_4_ = (int)((ulong)(local_78 * 8.31451e-07) >> 0x20);
        auVar16 = divpd(auVar14,auVar6);
        dVar3 = (double)local_c8._0_8_ + auVar16._0_8_;
        dVar7 = (double)local_c8._8_8_ + auVar16._8_8_;
        uVar12 = SUB84(dVar7,0);
        uVar13 = (undefined4)((ulong)dVar7 >> 0x20);
        local_c8._8_4_ = uVar12;
        local_c8._0_8_ = dVar3;
        local_c8._12_4_ = uVar13;
        local_118._16_4_ = uVar12;
        local_118._8_8_ = dVar3;
        local_118._20_4_ = uVar13;
        local_118._0_8_ = local_120;
      }
      iVar10 = iVar10 + 1;
      pSVar8 = SelectionManager::nextSelected(this_00,&local_124);
    } while (pSVar8 != (StuntDouble *)0x0);
    dVar3 = (double)iVar10;
  }
  lVar11 = 0;
  do {
    local_f8.super_Vector<double,_3U>.data_[lVar11] =
         local_f8.super_Vector<double,_3U>.data_[lVar11] / dVar3;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    local_f8.super_Vector<double,_3U>.data_[lVar11 + -4] =
         local_f8.super_Vector<double,_3U>.data_[lVar11 + -4] / dVar3;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->TempP_,&local_f8);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->TempJ_,(value_type *)local_118);
  return;
}

Assistant:

void Equipartition::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    const RealType kb = 8.31451e-7;
    Vector3d linMom_Temp;
    Vector3d angMom_Temp;
    int count = 0;
    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      count++;
      Vector3d linMom = sd->getVel() * sd->getMass();
      linMom_Temp[0] += linMom[0] * linMom[0] / (kb * sd->getMass());
      linMom_Temp[1] += linMom[1] * linMom[1] / (kb * sd->getMass());
      linMom_Temp[2] += linMom[2] * linMom[2] / (kb * sd->getMass());
      if (sd->isDirectional()) {
        Vector3d angMom       = sd->getJ();
        Mat3x3d momentInertia = sd->getI();
        angMom_Temp[0] += angMom[0] * angMom[0] / (kb * momentInertia(0, 0));
        angMom_Temp[1] += angMom[1] * angMom[1] / (kb * momentInertia(1, 1));
        angMom_Temp[2] += angMom[2] * angMom[2] / (kb * momentInertia(2, 2));
      }
    }

    linMom_Temp /= count;
    angMom_Temp /= count;
    TempP_.push_back(linMom_Temp);
    TempJ_.push_back(angMom_Temp);
  }